

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O0

size_t MULTILABEL::read_cached_label(shared_data *param_1,void *v,io_buf *cache)

{
  size_t sVar1;
  io_buf *in_RSI;
  char *in_RDI;
  size_t total;
  char *c;
  labels *ld;
  v_array<unsigned_int> *in_stack_ffffffffffffffd0;
  labels *in_stack_fffffffffffffff8;
  
  v_array<unsigned_int>::clear(in_stack_ffffffffffffffd0);
  sVar1 = io_buf::buf_read((io_buf *)c,(char **)total,(size_t)in_stack_fffffffffffffff8);
  if (sVar1 < 8) {
    sVar1 = 0;
  }
  else {
    bufread_label(in_stack_fffffffffffffff8,in_RDI,in_RSI);
    sVar1 = 8;
  }
  return sVar1;
}

Assistant:

size_t read_cached_label(shared_data*, void* v, io_buf& cache)
{
  labels* ld = (labels*)v;
  ld->label_v.clear();
  char* c;
  size_t total = sizeof(size_t);
  if (cache.buf_read(c, (int)total) < total)
    return 0;
  bufread_label(ld, c, cache);

  return total;
}